

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall FxUnaryNotBitwise::FxUnaryNotBitwise(FxUnaryNotBitwise *this,FxExpression *operand)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_UnaryNotBitwise,&operand->ScriptPosition)
  ;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxUnaryNotBitwise_007059f0;
  this->Operand = operand;
  return;
}

Assistant:

FxUnaryNotBitwise::FxUnaryNotBitwise(FxExpression *operand)
: FxExpression(EFX_UnaryNotBitwise, operand->ScriptPosition)
{
	Operand=operand;
}